

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::Stats::getVectorData(Vector3d *__return_storage_ptr__,Stats *this,int index)

{
  long lVar1;
  
  Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>);
  lVar1 = __dynamic_cast((this->data_).
                         super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                         ._M_impl.super__Vector_impl_data._M_start[index].accumulator,
                         &BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
  Vector<double,_3U>::operator=
            (&__return_storage_ptr__->super_Vector<double,_3U>,(Vector<double,_3U> *)(lVar1 + 0x10))
  ;
  return __return_storage_ptr__;
}

Assistant:

Vector3d Stats::getVectorData(int index) {
    assert(index >= 0 && index < ENDINDEX);
    Vector3d value;
    dynamic_cast<VectorAccumulator*>(data_[index].accumulator)
        ->getLastValue(value);
    return value;
  }